

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIVar1;
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIVar2;
  void *in_RDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair *in_stack_ffffffffffffffd0;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 in_stack_ffffffffffffffd8;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_00;
  
  pIVar1 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)LowerBound(in_RDI,in_ESI);
  this_00 = pIVar1;
  pIVar2 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)
           ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((pIVar1 == pIVar2) || (this_00->Size != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&stack0xffffffffffffffd0,in_ESI,in_RDX);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert
              (this_00,(ImGuiStoragePair *)in_stack_ffffffffffffffd8.val_p,in_stack_ffffffffffffffd0
              );
  }
  else {
    ((anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)&this_00->Data)->val_p = in_RDX;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_p = val;
}